

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_style_set_font(nk_context *ctx,nk_user_font *font)

{
  float fVar1;
  float fVar2;
  nk_panel *pnVar3;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x42a8,"void nk_style_set_font(struct nk_context *, const struct nk_user_font *)"
                 );
  }
  (ctx->style).font = font;
  (ctx->stacks).fonts.head = 0;
  if (ctx->current == (nk_window *)0x0) {
    return;
  }
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4b08,"void nk_layout_reset_min_row_height(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar3 = ctx->current->layout;
    if (pnVar3 != (nk_panel *)0x0) {
      fVar1 = (ctx->style).text.padding.y;
      fVar2 = (ctx->style).window.min_row_height_padding;
      (pnVar3->row).min_height = fVar2 + fVar2 + fVar1 + fVar1 + ((ctx->style).font)->height;
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4b0a,"void nk_layout_reset_min_row_height(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x4b09,"void nk_layout_reset_min_row_height(struct nk_context *)");
}

Assistant:

NK_API void
nk_style_set_font(struct nk_context *ctx, const struct nk_user_font *font)
{
    struct nk_style *style;
    NK_ASSERT(ctx);

    if (!ctx) return;
    style = &ctx->style;
    style->font = font;
    ctx->stacks.fonts.head = 0;
    if (ctx->current)
        nk_layout_reset_min_row_height(ctx);
}